

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddDefineFlag(void *arg,char *definition)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,definition,&local_31);
  cmMakefile::AddDefineFlag((cmMakefile *)arg,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void CCONV cmAddDefineFlag(void* arg, const char* definition)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  mf->AddDefineFlag(definition);
}